

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_ptr_tests.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_71cb::StatePointer_SetStateOutOfBounds_Test::TestBody
          (StatePointer_SetStateOutOfBounds_Test *this)

{
  bool bVar1;
  int iVar2;
  char *message;
  RE local_108;
  AssertHelper local_78 [4];
  type local_54;
  Foo foo;
  state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> p;
  ReturnSentinel gtest_sentinel;
  scoped_ptr<testing::internal::DeathTest> gtest_dt_ptr;
  DeathTest *gtest_dt;
  
  putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::state_ptr
            ((state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)&stack0xffffffffffffffb0,
             &local_54,0);
  bVar1 = testing::internal::AlwaysTrue();
  if (!bVar1) goto LAB_00121ce6;
  testing::internal::RE::RE(&local_108,"state value is out of bounds for this state_ptr");
  bVar1 = testing::internal::DeathTest::Create
                    ("p.set_state(1337)",&local_108,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
                     ,0x3f,&gtest_dt_ptr.ptr_);
  if (!bVar1) {
LAB_00121cda:
    testing::internal::RE::~RE(&local_108);
LAB_00121ce6:
    testing::Message::Message((Message *)&local_108);
    message = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0x3f,message);
    testing::internal::AssertHelper::operator=(local_78,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(local_78);
    testing::Message::~Message((Message *)&local_108);
    return;
  }
  if (gtest_dt_ptr.ptr_ == (DeathTest *)0x0) goto LAB_00121cc3;
  testing::internal::scoped_ptr<testing::internal::DeathTest>::scoped_ptr
            ((scoped_ptr<testing::internal::DeathTest> *)&gtest_sentinel,gtest_dt_ptr.ptr_);
  iVar2 = (*(gtest_dt_ptr.ptr_)->_vptr_DeathTest[2])();
  if (iVar2 == 0) {
    iVar2 = (*(gtest_dt_ptr.ptr_)->_vptr_DeathTest[3])(gtest_dt_ptr.ptr_);
    bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
    iVar2 = (*(gtest_dt_ptr.ptr_)->_vptr_DeathTest[4])(gtest_dt_ptr.ptr_,(ulong)bVar1);
    if ((char)iVar2 == '\0') {
      testing::internal::scoped_ptr<testing::internal::DeathTest>::~scoped_ptr
                ((scoped_ptr<testing::internal::DeathTest> *)&gtest_sentinel);
      goto LAB_00121cda;
    }
  }
  else if (iVar2 == 1) {
    testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
              ((ReturnSentinel *)&p,gtest_dt_ptr.ptr_);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::set_state
                ((state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)
                 &stack0xffffffffffffffb0,0x539);
    }
    (*(gtest_dt_ptr.ptr_)->_vptr_DeathTest[5])(gtest_dt_ptr.ptr_,2);
    testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel((ReturnSentinel *)&p);
  }
  testing::internal::scoped_ptr<testing::internal::DeathTest>::~scoped_ptr
            ((scoped_ptr<testing::internal::DeathTest> *)&gtest_sentinel);
LAB_00121cc3:
  testing::internal::RE::~RE(&local_108);
  return;
}

Assistant:

TEST(StatePointer, SetStateOutOfBounds) {
	Foo foo;
	state_ptr<Foo> p{&foo, 0};
	ASSERT_DEATH(p.set_state(1337), "state value is out of bounds for this state_ptr");
}